

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O1

void __thiscall license::hw_identifier::HwIdentifier::HwIdentifier(HwIdentifier *this,string *param)

{
  pointer pcVar1;
  logic_error *this_00;
  size_type sVar2;
  string tmp_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  string local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->_vptr_HwIdentifier = (_func_int **)&PTR__HwIdentifier_0056b818;
  *(undefined8 *)(this->m_data)._M_elems = 0;
  pcVar1 = (param->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + param->_M_string_length);
  if (local_80._M_string_length != 0) {
    sVar2 = 0;
    do {
      if (local_80._M_dataplus._M_p[sVar2] == '-') {
        local_80._M_dataplus._M_p[sVar2] = '\n';
      }
      sVar2 = sVar2 + 1;
    } while (local_80._M_string_length != sVar2);
  }
  unbase64(&local_60,&local_80);
  if ((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 8) {
    *(undefined8 *)(this->m_data)._M_elems =
         *(undefined8 *)
          local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    return;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"wrong identifier size ",param);
  std::logic_error::logic_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

HwIdentifier::HwIdentifier(const std::string& param) {
	string tmp_str(param);  // throw away const
	std::replace(tmp_str.begin(), tmp_str.end(), '-', '\n');
	vector<uint8_t> decoded = unbase64(tmp_str);
	if (decoded.size() != HW_IDENTIFIER_PROPRIETARY_DATA + 1) {
		cerr << decoded.size();
		throw logic_error("wrong identifier size " + param);
	}
	std::copy_n(decoded.begin(), HW_IDENTIFIER_PROPRIETARY_DATA + 1, m_data.begin());
}